

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

EmulatorEvent host_run_ms(Host *host,f64 delta_ms)

{
  Emulator *e;
  EmulatorEvent EVar1;
  ulong uVar2;
  Ticks TVar3;
  double dVar4;
  
  if ((host->rewind_state).rewinding == FALSE) {
    e = (host->hook_ctx).e;
    dVar4 = ((double)delta_ms * 4194304.0) / 1000.0;
    uVar2 = (ulong)dVar4;
    TVar3 = emulator_get_ticks(e);
    EVar1 = host_run_until_ticks
                      (host,((long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2) +
                            TVar3);
    TVar3 = emulator_get_ticks(e);
    host->last_ticks = TVar3;
    return EVar1;
  }
  __assert_fail("!host->rewind_state.rewinding",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x1b8,
                "EmulatorEvent host_run_ms(struct Host *, f64)");
}

Assistant:

EmulatorEvent host_run_ms(struct Host* host, f64 delta_ms) {
  assert(!host->rewind_state.rewinding);
  Emulator* e = host_get_emulator(host);
  Ticks delta_ticks = (Ticks)(delta_ms * CPU_TICKS_PER_SECOND / 1000);
  Ticks until_ticks = emulator_get_ticks(e) + delta_ticks;
  EmulatorEvent event = host_run_until_ticks(host, until_ticks);
  host->last_ticks = emulator_get_ticks(e);
  return event;
}